

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcUShapeProfileDef::IfcUShapeProfileDef(IfcUShapeProfileDef *this)

{
  *(undefined ***)&this->field_0xe0 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0xe8 = 0;
  *(char **)&this->field_0xf0 = "IfcUShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__008aa918);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8aa888;
  *(undefined8 *)&this->field_0xe0 = 0x8aa900;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x8aa8b0
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x8aa8d8;
  (this->FilletRadius).have = false;
  (this->EdgeRadius).have = false;
  (this->FlangeSlope).have = false;
  (this->CentreOfGravityInX).have = false;
  return;
}

Assistant:

IfcUShapeProfileDef() : Object("IfcUShapeProfileDef") {}